

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::internal::TracingMuxerImpl::ConsumerImpl::OnDisconnect(ConsumerImpl *this)

{
  allocator<char> local_59;
  string local_58;
  TracingError local_38;
  ConsumerImpl *local_10;
  ConsumerImpl *this_local;
  
  if (this->muxer_ != (TracingMuxerImpl *)0x0) {
    local_10 = this;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Peer disconnected",&local_59);
    TracingError::TracingError(&local_38,kDisconnected,&local_58);
    NotifyError(this,&local_38);
    TracingError::~TracingError(&local_38);
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::allocator<char>::~allocator(&local_59);
    NotifyStartComplete(this);
    NotifyStopComplete(this);
    this->connected_ = false;
    OnConsumerDisconnected(this->muxer_,this);
  }
  return;
}

Assistant:

void TracingMuxerImpl::ConsumerImpl::OnDisconnect() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  // If we're being destroyed, bail out.
  if (!muxer_)
    return;
#if PERFETTO_BUILDFLAG(PERFETTO_OS_ANDROID)
  if (!connected_ && backend_type_ == kSystemBackend) {
    PERFETTO_ELOG(
        "Unable to connect to the system tracing service as a consumer. On "
        "Android, use the \"perfetto\" command line tool instead to start "
        "system-wide tracing sessions");
  }
#endif  // PERFETTO_BUILDFLAG(PERFETTO_OS_ANDROID)

  // Notify the client about disconnection.
  NotifyError(TracingError{TracingError::kDisconnected, "Peer disconnected"});

  // Make sure the client doesn't hang in a blocking start/stop because of the
  // disconnection.
  NotifyStartComplete();
  NotifyStopComplete();

  // It shouldn't be necessary to call StopTracingSession. If we get this call
  // it means that the service did shutdown before us, so there is no point
  // trying it to ask it to stop the session. We should just remember to cleanup
  // the consumer vector.
  connected_ = false;

  // Notify the muxer that it is safe to destroy |this|. This is needed because
  // the ConsumerEndpoint stored in |service_| requires that |this| be safe to
  // access until OnDisconnect() is called.
  muxer_->OnConsumerDisconnected(this);
}